

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_helper.c
# Opt level: O0

void riscv_cpu_set_virt_enabled_riscv64(CPURISCVState_conflict1 *env,_Bool enable)

{
  int iVar1;
  CPUState *cpu;
  _Bool enable_local;
  CPURISCVState_conflict1 *env_local;
  
  iVar1 = riscv_has_ext(env,0x80);
  if (iVar1 != 0) {
    if ((env->virt & 1) != (ulong)enable) {
      cpu = env_cpu(env);
      tlb_flush_riscv64(cpu);
    }
    env->virt = env->virt & 0xfffffffffffffffe | (ulong)enable;
  }
  return;
}

Assistant:

void riscv_cpu_set_virt_enabled(CPURISCVState *env, bool enable)
{
    if (!riscv_has_ext(env, RVH)) {
        return;
    }

    /* Flush the TLB on all virt mode changes. */
    if (get_field(env->virt, VIRT_ONOFF) != enable) {
        tlb_flush(env_cpu(env));
    }

    env->virt = set_field(env->virt, VIRT_ONOFF, enable);
}